

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O2

IvVec2 * __thiscall
deqp::egl::UpdateResolutionCase::getNativePixelsPerInch
          (IvVec2 *__return_storage_ptr__,UpdateResolutionCase *this)

{
  Interval s;
  Library *egl;
  IVec2 bufPp10km;
  IVec2 winSize;
  IVec2 bufSize;
  uint7 uStack_25f;
  Vector<tcu::Interval,_2> local_248;
  Vector<tcu::Interval,_2> local_218;
  undefined1 local_1e8 [8];
  _func_int **pp_Stack_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1d8;
  double dStack_1c8;
  double dStack_1c0;
  IvVec2 bufPpiI;
  
  egl = EglTestContext::getLibrary((this->super_ResizeTest).super_TestCase.m_eglTestCtx);
  eglu::getSurfaceSize
            ((eglu *)&bufSize,egl,(this->super_ResizeTest).m_display,
             ((this->super_ResizeTest).m_surface.
              super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data
             .ptr)->m_surface);
  (*((this->super_ResizeTest).m_nativeWindow.
     super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.ptr)->
    _vptr_NativeWindow[7])(&winSize);
  eglu::getSurfaceResolution
            ((eglu *)&bufPp10km,egl,(this->super_ResizeTest).m_display,
             ((this->super_ResizeTest).m_surface.
              super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data
             .ptr)->m_surface);
  approximateInt(local_248.m_data,bufPp10km.m_data[0]);
  approximateInt(local_218.m_data,bufPp10km.m_data[1]);
  aStack_1d8._M_allocated_capacity = (size_type)local_248.m_data[0].m_hi;
  local_1e8 = (undefined1  [8])local_248.m_data[0]._0_8_;
  pp_Stack_1e0 = (_func_int **)local_248.m_data[0].m_lo;
  dStack_1c0 = local_218.m_data[0].m_hi;
  aStack_1d8._8_8_ = local_218.m_data[0]._0_8_;
  dStack_1c8 = local_218.m_data[0].m_lo;
  s.m_lo = 2540000.0;
  s._0_8_ = (ulong)uStack_25f << 8;
  s.m_hi = 2540000.0;
  tcu::operator/(&bufPpiI,(Vector<tcu::Interval,_2> *)local_1e8,s);
  ivVec2(&winSize);
  tcu::operator*((Vector<tcu::Interval,_2> *)local_1e8,&local_218,&bufPpiI);
  ivVec2(&bufSize);
  tcu::operator/(__return_storage_ptr__,(Vector<tcu::Interval,_2> *)local_1e8,&local_248);
  local_218.m_data[0]._4_4_ =
       (int)((__return_storage_ptr__->m_data[1].m_hi + __return_storage_ptr__->m_data[1].m_lo) * 0.5
            );
  local_218.m_data[0]._0_4_ =
       (int)((__return_storage_ptr__->m_data[0].m_hi + __return_storage_ptr__->m_data[0].m_lo) * 0.5
            );
  local_1e8 = (undefined1  [8])(this->super_ResizeTest).m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e0);
  std::operator<<((ostream *)&pp_Stack_1e0,"EGL surface size: ");
  tcu::operator<<((ostream *)&pp_Stack_1e0,&bufSize);
  std::operator<<((ostream *)&pp_Stack_1e0,"\n");
  std::operator<<((ostream *)&pp_Stack_1e0,"EGL surface pixel density (pixels / 10 km): ");
  tcu::operator<<((ostream *)&pp_Stack_1e0,&bufPp10km);
  std::operator<<((ostream *)&pp_Stack_1e0,"\n");
  std::operator<<((ostream *)&pp_Stack_1e0,"Native window size: ");
  tcu::operator<<((ostream *)&pp_Stack_1e0,&winSize);
  std::operator<<((ostream *)&pp_Stack_1e0,"\n");
  std::operator<<((ostream *)&pp_Stack_1e0,"Native pixel density (ppi): ");
  tcu::operator<<((ostream *)&pp_Stack_1e0,(Vector<int,_2> *)&local_218);
  std::operator<<((ostream *)&pp_Stack_1e0,"\n");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1e8,
             "Surface pixel density is less than one pixel per 10 km. Is the surface really visible from space?"
             ,(allocator<char> *)&local_248);
  tcu::ResultCollector::checkResult
            (&(this->super_ResizeTest).m_status,0 < bufPp10km.m_data[1] && 0 < bufPp10km.m_data[0],
             QP_TEST_RESULT_QUALITY_WARNING,(string *)local_1e8);
  std::__cxx11::string::~string((string *)local_1e8);
  return __return_storage_ptr__;
}

Assistant:

IvVec2 UpdateResolutionCase::getNativePixelsPerInch	(void)
{
	const Library&	egl			= m_eglTestCtx.getLibrary();
	const int		inchPer10km	= 254 * EGL_DISPLAY_SCALING;
	const IVec2		bufSize		= eglu::getSurfaceSize(egl, m_display, **m_surface);
	const IVec2		winSize		= m_nativeWindow->getScreenSize();
	const IVec2		bufPp10km	= eglu::getSurfaceResolution(egl, m_display, **m_surface);
	const IvVec2	bufPpiI		= (IvVec2(approximateInt(bufPp10km.x()),
										  approximateInt(bufPp10km.y()))
								   / Interval(inchPer10km));
	const IvVec2	winPpiI		= ivVec2(winSize) * bufPpiI / ivVec2(bufSize);
	const IVec2		winPpi		(int(winPpiI.x().midpoint()), int(winPpiI.y().midpoint()));

	m_log << TestLog::Message
		  << "EGL surface size: "							<< bufSize		<< "\n"
		  << "EGL surface pixel density (pixels / 10 km): "	<< bufPp10km	<< "\n"
		  << "Native window size: "							<< winSize		<< "\n"
		  << "Native pixel density (ppi): "					<< winPpi		<< "\n"
		  << TestLog::EndMessage;

	m_status.checkResult(bufPp10km.x() >= 1 && bufPp10km.y() >= 1,
						 QP_TEST_RESULT_QUALITY_WARNING,
						 "Surface pixel density is less than one pixel per 10 km. "
						 "Is the surface really visible from space?");

	return winPpiI;
}